

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O2

void __thiscall
Eigen::internal::gemm_pack_rhs<double,_long,_4,_0,_false,_true>::operator()
          (gemm_pack_rhs<double,_long,_4,_0,_false,_true> *this,double *blockB,double *rhs,
          long rhsStride,long depth,long cols,long stride,long offset)

{
  long lVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  double *pdVar10;
  long lVar11;
  bool bVar12;
  
  if ((depth <= stride) && (offset <= stride)) {
    lVar1 = cols / 4;
    lVar2 = lVar1 * 4;
    lVar11 = 0;
    lVar8 = 0;
    if (0 < depth) {
      lVar8 = depth;
    }
    pdVar10 = rhs + rhsStride;
    pdVar4 = rhs + rhsStride * 2;
    pdVar9 = rhs + rhsStride * 3;
    lVar6 = 0;
    pdVar5 = rhs;
    for (; SBORROW8(lVar11,lVar2) != lVar11 + lVar1 * -4 < 0; lVar11 = lVar11 + 4) {
      lVar7 = 0;
      lVar3 = lVar8;
      while (bVar12 = lVar3 != 0, lVar3 = lVar3 + -1, bVar12) {
        blockB[offset * 4 + lVar6 + lVar7] = *(double *)((long)pdVar5 + lVar7 * 2);
        blockB[offset * 4 + lVar6 + lVar7 + 1] = *(double *)((long)pdVar10 + lVar7 * 2);
        blockB[offset * 4 + lVar6 + lVar7 + 2] = *(double *)((long)pdVar4 + lVar7 * 2);
        blockB[offset * 4 + lVar6 + lVar7 + 3] = *(double *)((long)pdVar9 + lVar7 * 2);
        lVar7 = lVar7 + 4;
      }
      lVar6 = lVar6 + stride * 4 + depth * -4 + lVar7;
      pdVar5 = pdVar5 + rhsStride * 4;
      pdVar10 = pdVar10 + rhsStride * 4;
      pdVar4 = pdVar4 + rhsStride * 4;
      pdVar9 = pdVar9 + rhsStride * 4;
    }
    pdVar10 = rhs + lVar1 * rhsStride * 4;
    for (; lVar2 < cols; lVar2 = lVar2 + 1) {
      for (lVar1 = 0; lVar8 != lVar1; lVar1 = lVar1 + 1) {
        blockB[lVar6 + offset + lVar1] = pdVar10[lVar1];
      }
      lVar6 = lVar6 + (stride - depth) + lVar1;
      pdVar10 = pdVar10 + rhsStride;
    }
    return;
  }
  __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ckirksey3[P]extended-kalman-filter-cpp/src/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                ,0x4c6,
                "void Eigen::internal::gemm_pack_rhs<double, long, 4, 0, false, true>::operator()(Scalar *, const Scalar *, Index, Index, Index, Index, Index) [Scalar = double, Index = long, nr = 4, StorageOrder = 0, Conjugate = false, PanelMode = true]"
               );
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_rhs<Scalar, Index, nr, ColMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockB, const Scalar* rhs, Index rhsStride, Index depth, Index cols, Index stride, Index offset)
{
  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK RHS COLMAJOR");
  EIGEN_UNUSED_VARIABLE(stride)
  EIGEN_UNUSED_VARIABLE(offset)
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index packet_cols = (cols/nr) * nr;
  Index count = 0;
  for(Index j2=0; j2<packet_cols; j2+=nr)
  {
    // skip what we have before
    if(PanelMode) count += nr * offset;
    const Scalar* b0 = &rhs[(j2+0)*rhsStride];
    const Scalar* b1 = &rhs[(j2+1)*rhsStride];
    const Scalar* b2 = &rhs[(j2+2)*rhsStride];
    const Scalar* b3 = &rhs[(j2+3)*rhsStride];
    for(Index k=0; k<depth; k++)
    {
                blockB[count+0] = cj(b0[k]);
                blockB[count+1] = cj(b1[k]);
      if(nr==4) blockB[count+2] = cj(b2[k]);
      if(nr==4) blockB[count+3] = cj(b3[k]);
      count += nr;
    }
    // skip what we have after
    if(PanelMode) count += nr * (stride-offset-depth);
  }

  // copy the remaining columns one at a time (nr==1)
  for(Index j2=packet_cols; j2<cols; ++j2)
  {
    if(PanelMode) count += offset;
    const Scalar* b0 = &rhs[(j2+0)*rhsStride];
    for(Index k=0; k<depth; k++)
    {
      blockB[count] = cj(b0[k]);
      count += 1;
    }
    if(PanelMode) count += (stride-offset-depth);
  }
}